

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

void FACT_INTERNAL_BeginReleaseRPC(FACTSoundInstance *sound,uint16_t releaseMS)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,releaseMS) != 0) {
    sound->fadeType = '\x03';
    uVar2 = FAudio_timems();
    sound->fadeStart = uVar2;
    sound->fadeTarget = releaseMS;
    puVar1 = &sound->parentCue->state;
    *puVar1 = *puVar1 | 0x10;
    return;
  }
  FACT_INTERNAL_DestroySound(sound);
  return;
}

Assistant:

void FACT_INTERNAL_BeginReleaseRPC(FACTSoundInstance *sound, uint16_t releaseMS)
{
	if (releaseMS == 0)
	{
		/* No release RPC? Screw it, just delete us */
		FACT_INTERNAL_DestroySound(sound);
		return;
	}

	sound->fadeType = 3; /* Release RPC */
	sound->fadeStart = FAudio_timems();
	sound->fadeTarget = releaseMS;

	sound->parentCue->state |= FACT_STATE_STOPPING;
}